

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_23::debug_test(void)

{
  char *pcVar1;
  string *this;
  string local_f8;
  string local_d8;
  ulong local_b8;
  uint64_t res;
  allocator<char> local_99;
  string local_98 [8];
  string script;
  undefined8 uStack_40;
  skiwi_parameters params;
  
  skiwi::skiwi_parameters::skiwi_parameters((skiwi_parameters *)&uStack_40);
  script.field_2._8_8_ = uStack_40;
  skiwi::scheme_with_skiwi(0);
  std::allocator<char>::allocator();
  pcVar1 = "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add4 5)\n(define x 7)\n";
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add4 5)\n(define x 7)\n",
             &local_99);
  std::allocator<char>::~allocator(&local_99);
  local_b8 = skiwi::skiwi_run_raw((skiwi *)local_98,(string *)pcVar1);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_f8,local_b8,6);
  first_line(&local_d8,&local_f8);
  TestEq<char_const*,std::__cxx11::string>
            ("runtime error: closure expected:",&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1526,"void skiwi::(anonymous namespace)::debug_test()");
  std::__cxx11::string::~string((string *)&local_d8);
  this = &local_f8;
  std::__cxx11::string::~string((string *)this);
  skiwi::skiwi_quit((skiwi *)this);
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void debug_test()
    {
    using namespace skiwi;
    skiwi_parameters params;
    params.trace = nullptr;
    params.stderror = &std::cout;
    params.stdoutput = nullptr;
    scheme_with_skiwi(nullptr, nullptr, params);

#ifdef _WIN32
    std::string script = R"(
(load (string-append "data\\" "load_test_2.scm"))
(add4 5)
(define x 7)
)";

#else

    std::string script = R"(
(load (string-append "./data/" "load_test_2.scm"))
(add4 5)
(define x 7)
)";

#endif
    uint64_t res = skiwi_run_raw(script);
    TEST_EQ("runtime error: closure expected:", first_line(skiwi_raw_to_string(res)));
    skiwi_quit();
    }